

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O3

bool __thiscall Personality::PushGreenCard(Personality *this,GreenCard *card)

{
  list<Follower_*,_std::allocator<Follower_*>_> *plVar1;
  Type TVar2;
  _List_node_base *p_Var3;
  size_t *psVar4;
  
  TVar2 = Card::getType(&card->super_Card);
  if (TVar2 == FOLLOWER) {
    if ((ulong)(long)this->maxFollowers <=
        (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl._M_node.
        _M_size) {
      return false;
    }
    plVar1 = &this->followers;
  }
  else {
    if ((ulong)(long)this->maxItems <=
        (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node._M_size) {
      return false;
    }
    plVar1 = (list<Follower_*,_std::allocator<Follower_*>_> *)&this->items;
  }
  psVar4 = &(plVar1->super__List_base<Follower_*,_std::allocator<Follower_*>_>)._M_impl._M_node.
            _M_size;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)card;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  *psVar4 = *psVar4 + 1;
  return true;
}

Assistant:

bool Personality::PushGreenCard(GreenCard * card)                   //pushes new item or follower
{
    if (card->getType() == FOLLOWER)
    {
        if (followers.size() >= maxFollowers)
            return false;

        Follower * newFollow = reinterpret_cast<Follower*>(card);
        followers.push_back(newFollow);
    }
    else
    {
        if (items.size() >= maxItems)
            return false;

        Item * newItem = reinterpret_cast<Item*>(card);
        items.push_back(newItem);
    }
    return true;
}